

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_div_m68k(float64 a,float64 b,float_status *s)

{
  int iVar1;
  int iVar2;
  float64 fVar3;
  double dVar4;
  union_float64 ub;
  union_float64 ua;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined8 uStack_20;
  
  local_40 = (double)b;
  local_30 = (double)a;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    float64_input_flush2((float64 *)&local_30,(float64 *)&local_40,s);
    local_28 = local_30;
    uStack_20 = 0;
    iVar1 = __fpclassify(local_30);
    a = (float64)local_28;
    if ((iVar1 == 2) || (b = (float64)local_40, iVar1 == 4)) {
      local_38 = local_40;
      iVar2 = __fpclassify(local_40);
      b = (float64)local_38;
      if (iVar2 == 4) {
        dVar4 = local_28 / local_38;
        if (ABS(dVar4) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if ((ABS(dVar4) <= 2.2250738585072014e-308) && (iVar1 != 2)) goto LAB_0064a78b;
        return (float64)dVar4;
      }
    }
  }
LAB_0064a78b:
  fVar3 = soft_f64_div(a,b,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_div(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_div, soft_f64_div,
                        f64_div_pre, f64_div_post, NULL, NULL);
}